

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cc
# Opt level: O2

void cnn::Initialize(int *argc,char ***argv,uint random_seed,bool shared_parameters)

{
  pointer ppDVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  Device_CPU *this_00;
  undefined7 in_register_00000009;
  undefined8 uVar5;
  iterator __begin2;
  pointer ppDVar6;
  uint random_seed_local;
  int argi;
  unsigned_long num_mb;
  undefined4 local_141c;
  vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> gpudevices;
  string a2;
  string arg;
  istringstream c;
  
  uVar5 = CONCAT71(in_register_00000009,shared_parameters);
  gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  num_mb = 0x200;
  argi = 1;
  if (1 < *argc) {
    local_141c = (undefined4)uVar5;
    do {
      std::__cxx11::string::string((string *)&arg,(*argv)[1],(allocator *)&c);
      bVar2 = std::operator==(&arg,"--cnn-mem");
      if ((bVar2) || (bVar2 = std::operator==(&arg,"--cnn_mem"), bVar2)) {
        if (*argc < 2) {
          std::operator<<((ostream *)&std::cerr,
                          "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n"
                         );
          goto LAB_002607b9;
        }
        std::__cxx11::string::string((string *)&a2,(*argv)[2],(allocator *)&c);
        std::__cxx11::istringstream::istringstream((istringstream *)&c,(string *)&a2,_S_in);
        std::istream::_M_extract<unsigned_long>((ulong *)&c);
LAB_002604e2:
        RemoveArgs(argc,argv,&argi,(int)uVar5);
        std::__cxx11::istringstream::~istringstream((istringstream *)&c);
        std::__cxx11::string::~string((string *)&a2);
        bVar2 = true;
      }
      else {
        bVar2 = std::operator==(&arg,"--cnn-seed");
        if ((bVar2) || (bVar2 = std::operator==(&arg,"--cnn_seed"), bVar2)) {
          if (*argc < 2) {
            std::operator<<((ostream *)&std::cerr,
                            "[cnn] --cnn-seed expects an argument (the random number seed)\n");
            goto LAB_002607b9;
          }
          std::__cxx11::string::string((string *)&a2,(*argv)[2],(allocator *)&c);
          std::__cxx11::istringstream::istringstream((istringstream *)&c,(string *)&a2,_S_in);
          std::istream::_M_extract<unsigned_int>((uint *)&c);
          goto LAB_002604e2;
        }
        bVar2 = false;
        lVar3 = std::__cxx11::string::find((char *)&arg,0x2e45b5);
        if (lVar3 == 0) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] Bad command line argument: ");
          poVar4 = std::operator<<(poVar4,(string *)&arg);
          std::endl<char,std::char_traits<char>>(poVar4);
LAB_002607b9:
          abort();
        }
      }
      std::__cxx11::string::~string((string *)&arg);
    } while ((bVar2) && (1 < *argc));
    shared_parameters = SUB41(local_141c,0);
  }
  random_seed_local = random_seed;
  if (random_seed == 0) {
    std::random_device::random_device((random_device *)&c);
    random_seed_local = std::random_device::_M_getval();
    std::random_device::~random_device((random_device *)&c);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] random seed: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::endl<char,std::char_traits<char>>(poVar4);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this,(ulong)random_seed_local);
  rndeng = this;
  poVar4 = std::operator<<((ostream *)&std::cerr,"[cnn] allocating memory: ");
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::operator<<(poVar4,"MB\n");
  this_00 = (Device_CPU *)operator_new(0x80);
  Device_CPU::Device_CPU(this_00,(int)num_mb,shared_parameters);
  _c = this_00;
  std::vector<cnn::Device*,std::allocator<cnn::Device*>>::emplace_back<cnn::Device*>
            ((vector<cnn::Device*,std::allocator<cnn::Device*>> *)&devices,(Device **)&c);
  ppDVar1 = gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar3 = 0;
  }
  else {
    lVar3 = 1;
    for (ppDVar6 = gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppDVar6 != ppDVar1;
        ppDVar6 = ppDVar6 + 1) {
      _c = (Device_CPU *)*ppDVar6;
      std::vector<cnn::Device_*,_std::allocator<cnn::Device_*>_>::push_back
                ((vector<cnn::Device_*,_std::allocator<cnn::Device_*>_> *)&devices,(value_type *)&c)
      ;
    }
  }
  default_device = *(long *)(devices + lVar3 * 8);
  fxs = *(undefined8 *)(default_device + 0x18);
  dEdfs = *(undefined8 *)(default_device + 0x20);
  ps = *(undefined8 *)(default_device + 0x28);
  kSCALAR_MINUSONE = *(undefined8 *)(default_device + 0x30);
  kSCALAR_ONE = *(undefined8 *)(default_device + 0x38);
  kSCALAR_ZERO = *(undefined8 *)(default_device + 0x40);
  std::operator<<((ostream *)&std::cerr,"[cnn] memory allocation done.\n");
  std::_Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>::~_Vector_base
            (&gpudevices.super__Vector_base<cnn::Device_*,_std::allocator<cnn::Device_*>_>);
  return;
}

Assistant:

void Initialize(int& argc, char**& argv, unsigned random_seed, bool shared_parameters) {
  vector<Device*> gpudevices;
#if HAVE_CUDA
  cerr << "[cnn] initializing CUDA\n";
  gpudevices = Initialize_GPU(argc, argv);
#endif
  unsigned long num_mb = 512UL;
  int argi = 1;
  while(argi < argc) {
    string arg = argv[argi];
    if (arg == "--cnn-mem" || arg == "--cnn_mem") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-mem expects an argument (the memory, in megabytes, to reserve)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> num_mb;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg == "--cnn-seed" || arg == "--cnn_seed") {
      if ((argi + 1) > argc) {
        cerr << "[cnn] --cnn-seed expects an argument (the random number seed)\n";
        abort();
      } else {
        string a2 = argv[argi+1];
        istringstream c(a2); c >> random_seed;
        RemoveArgs(argc, argv, argi, 2);
      }
    } else if (arg.find("--cnn") == 0) {
      cerr << "[cnn] Bad command line argument: " << arg << endl;
      abort();
    } else { break; }
  }
  if (random_seed == 0) {
    random_device rd;
    random_seed = rd();
  }
  cerr << "[cnn] random seed: " << random_seed << endl;
  rndeng = new mt19937(random_seed);

  cerr << "[cnn] allocating memory: " << num_mb << "MB\n";
  devices.push_back(new Device_CPU(num_mb, shared_parameters));
  int default_index = 0;
  if (gpudevices.size() > 0) {
    for (auto gpu : gpudevices)
      devices.push_back(gpu);
    default_index++;
  }
  default_device = devices[default_index];

  // TODO these should be accessed through the relevant device and removed here
  fxs = default_device->fxs;
  dEdfs = default_device->dEdfs;
  ps = default_device->ps;
  kSCALAR_MINUSONE = default_device->kSCALAR_MINUSONE;
  kSCALAR_ONE = default_device->kSCALAR_ONE;
  kSCALAR_ZERO = default_device->kSCALAR_ZERO;
  cerr << "[cnn] memory allocation done.\n";
}